

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsTTDNotifyContextDestroy(JsContextRef context)

{
  ThreadContext *pTVar1;
  
  pTVar1 = ThreadContext::GetContextForCurrentThread();
  if ((pTVar1 != (ThreadContext *)0x0) && (pTVar1->TTDLog != (EventLog *)0x0)) {
    TTD::ThreadContextTTD::NotifyCtxDestroyInRecord
              (pTVar1->TTDContext,*(ScriptContext **)(*(long *)((long)context + 8) + 0x490));
  }
  return JsNoError;
}

Assistant:

CHAKRA_API JsTTDNotifyContextDestroy(_In_ JsContextRef context)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
    if(threadContext && threadContext->IsRuntimeInTTDMode())
    {
        Js::ScriptContext* ctx = static_cast<JsrtContext*>(context)->GetScriptContext();
        threadContext->TTDContext->NotifyCtxDestroyInRecord(ctx);
    }

    return JsNoError;
#endif
}